

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::configure(CoreBroker *this,string_view configureString)

{
  string_view message;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *in_RSI;
  BrokerBase *in_RDI;
  int result;
  BrokerBase *in_stack_000001b8;
  undefined1 in_stack_000001c0 [16];
  BrokerState in_stack_ffffffffffffffac;
  BrokerState in_stack_ffffffffffffffae;
  BrokerBase *in_stack_ffffffffffffffb0;
  BrokerState newState;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  bVar1 = BrokerBase::transitionBrokerState
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae,in_stack_ffffffffffffffac);
  newState = (BrokerState)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
  if (bVar1) {
    iVar2 = BrokerBase::parseArgs(in_stack_000001b8,(string_view)in_stack_000001c0);
    if (iVar2 == 0) {
      (**(code **)(*(long *)&in_RDI->global_id + 0x10))(&in_RDI->global_id);
    }
    else {
      BrokerBase::setBrokerState(in_RDI,newState);
      if (iVar2 < 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffc0,(char *)in_RDI);
        message._M_str = in_RSI;
        message._M_len = in_stack_ffffffffffffffc8;
        InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_ffffffffffffffc0,message);
        __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::configure(std::string_view configureString)
{
    if (transitionBrokerState(BrokerState::CREATED, BrokerState::CONFIGURING)) {
        auto result = parseArgs(configureString);
        if (result != 0) {
            setBrokerState(BrokerState::CREATED);
            if (result < 0) {
                throw(helics::InvalidParameter("invalid arguments in configure string"));
            }
            return;
        }
        configureBase();
    }
}